

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
mxx::scatter_recv<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,int root,comm *comm)

{
  MPI_Datatype poVar1;
  MPI_Comm poVar2;
  undefined1 local_40 [8];
  datatype sizedt;
  size_t size;
  comm *comm_local;
  int root_local;
  vector<int,_std::allocator<int>_> *result;
  
  get_datatype<unsigned_long>();
  poVar1 = datatype::type((datatype *)local_40);
  poVar2 = mxx::comm::operator_cast_to_ompi_communicator_t_(comm);
  MPI_Bcast(&sizedt.builtin,1,poVar1,root,poVar2);
  scatter_recv<int>(__return_storage_ptr__,sizedt._16_8_,root,comm);
  datatype::~datatype((datatype *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> scatter_recv(int root, const mxx::comm& comm = mxx::comm()) {
    size_t size;
    mxx::datatype sizedt = mxx::get_datatype<size_t>();
    MPI_Bcast(&size, 1, sizedt.type(), root, comm);
    // now everybody knows the size
    std::vector<T> result = scatter_recv<T>(size, root, comm);
    return result;
}